

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list_functions.h
# Opt level: O2

void LinkedList::delete_all<string_tokenizer::Token>(Node<string_tokenizer::Token> **head)

{
  Node<string_tokenizer::Token> *this;
  
  this = *head;
  if (this == (Node<string_tokenizer::Token> *)0x0) {
    return;
  }
  if (this->_next != (Node<string_tokenizer::Token> *)0x0) {
    delete_all<string_tokenizer::Token>(&this->_next);
    this = *head;
    if (this == (Node<string_tokenizer::Token> *)0x0) {
      this = (Node<string_tokenizer::Token> *)0x0;
      goto LAB_00105e92;
    }
  }
  std::__cxx11::string::~string((string *)this);
LAB_00105e92:
  operator_delete(this);
  *head = (Node<string_tokenizer::Token> *)0x0;
  return;
}

Assistant:

void delete_all(Node<T>*& head) {
        if (head == NULL)
            return;
        if (head->_next != NULL)
            delete_all(head->_next);
        delete head;
        head = NULL;
    }